

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void MListInsert(Col_Word *nodePtr,size_t index,Col_Word list)

{
  ulong length;
  ulong *mvector;
  byte *list_00;
  size_t first;
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  size_t max;
  size_t sVar4;
  Col_Word CVar5;
  Col_Word CVar6;
  size_t max_00;
  Col_Word *pCVar7;
  uint uVar8;
  MergeListChunksInfo info;
  size_t local_40;
  Col_Word local_38;
  
  sVar3 = Col_ListLength(*nodePtr);
  max = Col_ListLength(list);
  if (sVar3 == 0) {
    CVar5 = Col_CopyMList(list);
    *nodePtr = CVar5;
    return;
  }
  length = max + sVar3;
  max_00 = sVar3 - index;
LAB_001110ae:
  do {
    mvector = (ulong *)*nodePtr;
    uVar8 = 0;
    if (mvector != (ulong *)0x0) {
      if (((ulong)mvector & 0xf) == 0) {
        uVar8 = -(uint)(((byte)*mvector & 2) == 0) | (byte)*mvector & 0xfffffffe;
      }
      else {
        uVar8 = immediateWordTypes[(uint)mvector & 0x1f];
      }
    }
    if (uVar8 == 0x1a) {
      if (max <= ((*mvector >> 3 & 0xffffffffffffffe0) - 0x10 >> 3) - sVar3) {
        Col_MVectorSetLength((Col_Word)mvector,length);
        memmove(mvector + index + max + 2,mvector + index + 2,max_00 * 8);
        local_38 = *nodePtr;
        local_40 = index;
        Col_TraverseListChunks(list,0,max,0,MergeListChunksProc,&local_40,(size_t *)0x0);
        return;
      }
    }
    else if (uVar8 == 0x26) {
      sVar3 = (size_t)*(ushort *)((long)mvector + 2);
      CVar5 = mvector[2];
      if (sVar3 == 0) {
        sVar3 = Col_ListLength(CVar5);
      }
      if (index == sVar3) {
        CVar6 = *nodePtr;
        uVar8 = (uint)*(byte *)(CVar6 + 1);
        if ((uVar8 < 2) || (bVar1 = GetDepth(CVar5), (int)(uVar8 - 1) <= (int)(uint)bVar1))
        goto LAB_001114a3;
        pCVar7 = (Col_Word *)(CVar6 + 0x10);
      }
      else {
LAB_001114a3:
        if (index < sVar3 || index - sVar3 == 0) {
          pCVar7 = (Col_Word *)(*nodePtr + 0x10);
        }
        else {
          pCVar7 = (Col_Word *)(*nodePtr + 0x18);
          index = index - sVar3;
        }
      }
      MListInsert(pCVar7,index,list);
      CVar5 = *nodePtr;
      goto LAB_001114fa;
    }
    if (length < 0x27) {
      CVar5 = Col_NewMVector(0,length,(Col_Word *)0x0);
      local_40 = 0;
      local_38 = CVar5;
      Col_TraverseListChunks(*nodePtr,0,index,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      Col_TraverseListChunks(list,0,max,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      Col_TraverseListChunks(*nodePtr,index,max_00,0,MergeListChunksProc,&local_40,(size_t *)0x0);
      *nodePtr = CVar5;
      return;
    }
    if (uVar8 == 0x1e) {
      if (*(byte *)((long)mvector + 1) == 0) goto LAB_0011112f;
LAB_00111171:
      ConvertToMConcatNode(nodePtr);
      goto LAB_001110ae;
    }
    if (uVar8 == 0x22) goto LAB_00111171;
LAB_0011112f:
    if ((sVar3 < index || max_00 == 0) || index == 0) {
      CVar6 = Col_CopyMList(list);
      CVar5 = *nodePtr;
      if (index != 0) {
        CVar5 = CVar6;
        CVar6 = *nodePtr;
      }
      CVar5 = NewMConcatList(CVar6,CVar5);
      *nodePtr = CVar5;
LAB_001114fa:
      UpdateMConcatNode(CVar5);
      return;
    }
    sVar4 = Col_ListLength((Col_Word)mvector);
    pCVar7 = (Col_Word *)*nodePtr;
    if (pCVar7 == (Col_Word *)0x0) {
      uVar8 = 0;
    }
    else if (((ulong)pCVar7 & 0xf) == 0) {
      uVar8 = -(uint)(((byte)*pCVar7 & 2) == 0) | (byte)*pCVar7 & 0xfffffffe;
    }
    else {
      uVar8 = immediateWordTypes[(uint)pCVar7 & 0x1f];
    }
    if ((int)uVar8 < 0x16) {
      if (uVar8 == 0xfffffff9) {
        CVar5 = NewMConcatList(index << 5 | 0x14,(sVar4 - index) * 0x20 | 0x14);
        *nodePtr = CVar5;
      }
      else {
        if (uVar8 != 0xffffffff) goto LAB_00111235;
        CVar5 = Col_Sublist((Col_Word)pCVar7,0,index - 1);
        CVar6 = Col_Sublist(*nodePtr,index,sVar4 - 1);
        CVar5 = NewMConcatList(CVar5,CVar6);
        *nodePtr = CVar5;
      }
    }
    else {
      if ((uVar8 == 0x16) || (uVar8 == 0x1a)) {
        pCVar7 = pCVar7 + 2;
      }
      else if (uVar8 == 0x1e) {
        list_00 = (byte *)pCVar7[1];
        if (list_00 == (byte *)0x0) {
          uVar2 = 0;
        }
        else if (((ulong)list_00 & 0xf) == 0) {
          uVar2 = -(uint)((*list_00 & 2) == 0) | *list_00 & 0xfffffffe;
        }
        else {
          uVar2 = immediateWordTypes[(uint)list_00 & 0x1f];
        }
        first = pCVar7[2];
        if (uVar2 == 0xffffffff) {
          pCVar7 = (Col_Word *)Col_Sublist((Col_Word)list_00,first,(index + first) - 1);
          CVar5 = Col_Sublist(*nodePtr,index + first,(first - 1) + sVar4);
          CVar5 = NewMConcatList((Col_Word)pCVar7,CVar5);
          *nodePtr = CVar5;
        }
        else if (uVar2 == 0x16) {
          pCVar7 = (Col_Word *)(list_00 + first * 8 + 0x10);
        }
      }
LAB_00111235:
      CVar5 = Col_NewMVector(0,sVar4 - index,pCVar7 + index);
      if (uVar8 == 0x1a) {
        Col_MVectorSetLength(*nodePtr,index);
        CVar6 = *nodePtr;
      }
      else {
        CVar6 = Col_NewMVector(0,index,pCVar7);
      }
      CVar5 = NewMConcatList(CVar6,CVar5);
      *nodePtr = CVar5;
    }
  } while( true );
}

Assistant:

static void
MListInsert(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to insert into. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t index,       /*!< Index of insertion point. */
    Col_Word list)      /*!< List to insert. */
{
    size_t length = Col_ListLength(*nodePtr);
    size_t listLength = Col_ListLength(list);
    int type;

    ASSERT(index <= length);
    ASSERT(SIZE_MAX-length >= listLength);
    ASSERT(listLength > 0);

    if (length == 0) {
        /*
         * Replace content.
         */

        *nodePtr = Col_CopyMList(list);
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First try to alter mutable types if possible.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        Col_Word left = WORD_CONCATLIST_LEFT(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(left);
        }

        if (index == leftLength && WORD_CONCATLIST_DEPTH(*nodePtr) > 1) {
            /*
             * Insertion point is just between the two arms. Insert into
             * the shallowest one to balance tree.
             */

            if (GetDepth(left) < WORD_CONCATLIST_DEPTH(*nodePtr)-1) {
                /*
                 * Right is deeper, insert into left.
                 */

                MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index,
                        list);
                UpdateMConcatNode(*nodePtr);
                return;
            }
        }

        if (index <= leftLength) {
            /*
             * Insert into left.
             */

            MListInsert(&WORD_CONCATLIST_LEFT(*nodePtr), index, list);
        } else {
            /*
             * Insert into right.
             */

            MListInsert(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    index-leftLength, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
        }

    case WORD_TYPE_MVECTOR: {
        size_t maxLength = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(*nodePtr)
                * CELL_SIZE);
        Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
        if (listLength <= maxLength-length) {
            /*
             * Insert data directly into available space.
             */

            MergeListChunksInfo info;

            Col_MVectorSetLength(*nodePtr, length+listLength);

            /*
             * Move trailing elements.
             */

            memmove(elements+index+listLength, elements+index,
                    (length-index) * sizeof(*elements));

            /*
             * Copy elements from list.
             */

            info.length = index;
            info.vector = *nodePtr;
            Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                    &info, NULL);
            ASSERT(info.length == index+listLength);
            return;
        }

        /*
         * Try other methods below.
         */

        break;
        }

    }

    if (length+listLength <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        Col_Word node = Col_NewMVector(0, length+listLength, NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, index, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(list, 0, listLength, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, index, length-index, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length+listLength);

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types and mutable with no available space.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (index > 0 && index < length) {
            /*
             * Split at insertion point then retry.
             */

            SplitMutableAt(nodePtr, index);
            goto start;
        }

        /*
         * Build a mutable concat node with current node and list to insert.
         */

        list = Col_CopyMList(list);
        if (index == 0) {
            /*
             * Insert before.
             */

            *nodePtr = NewMConcatList(list, *nodePtr);
        } else {
            /*
             * Insert after.
             */

            ASSERT(index >= length);
            *nodePtr = NewMConcatList(*nodePtr, list);
        }
        UpdateMConcatNode(*nodePtr);
        return;
    }
}